

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,in_RSI,"\n");
  (**(code **)(*in_RDI + 0x10))(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SendLn(const std::string& message) { Send(message + "\n"); }